

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall
FloatInstance::FloatInstance
          (FloatInstance *this,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  char *__nptr;
  undefined8 *puVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  double dVar5;
  string *in_stack_00000008;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9d;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  allocator *type;
  Instance *in_stack_ffffffffffffffb0;
  allocator local_39;
  string local_38 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  
  type = &local_39;
  local_18 = in_RDX;
  str = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Float",type);
  Instance::Instance(in_stack_ffffffffffffffb0,(string *)type);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  *(undefined ***)in_RDI = &PTR__FloatInstance_0020edc0;
  bVar1 = std::operator==(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff9f,
                                                  CONCAT16(in_stack_ffffffffffffff9e,
                                                           CONCAT15(in_stack_ffffffffffffff9d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff9c,
                                                  in_stack_ffffffffffffff98)))));
  if ((!bVar1) &&
     (bVar1 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff9e,
                                                                     CONCAT15(
                                                  in_stack_ffffffffffffff9d,
                                                  CONCAT14(in_stack_ffffffffffffff9c,
                                                           in_stack_ffffffffffffff98))))), !bVar1))
  {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: invalid message.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_18);
  if (sVar2 != 2) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  bVar1 = Grammar::is_variable(in_stack_00000008);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,1);
    bVar1 = Grammar::is_float_value(str);
    if (bVar1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_18,0);
      std::__cxx11::string::operator=((string *)(in_RDI + 0x38),(string *)pvVar3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_18,1);
      __nptr = (char *)std::__cxx11::string::c_str();
      dVar5 = atof(__nptr);
      *(float *)(in_RDI + 0x58) = (float)dVar5;
      return;
    }
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

FloatInstance::FloatInstance(const std::string& message_name, const std::vector<std::string>& arguments) :
    Instance("Float") {
    if (message_name == "create:withValue:" || message_name == "createIfNotExists:withValue:") {
        if (arguments.size() != 2)
            throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
        if (!Grammar::is_variable(arguments[0]) || !Grammar::is_float_value(arguments[1]))
            throw EXC_INVALID_ARGUMENT;
        _name = arguments[0];
        _value = atof(arguments[1].c_str());
    }
    else
        throw EXC_INVALID_MESSAGE;
}